

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YolactDetector.cpp
# Opt level: O1

int __thiscall
Yolact::detect(Yolact *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects,
              string *targetName)

{
  int *piVar1;
  vector<Object,_std::allocator<Object>_> *objects_00;
  undefined8 uVar2;
  undefined8 uVar3;
  uint h;
  uint w;
  pointer pOVar4;
  pointer pfVar5;
  int iVar6;
  int iVar7;
  pointer pfVar8;
  int iVar9;
  size_type __new_size;
  void *pvVar10;
  void *pvVar11;
  int iVar12;
  ulong uVar13;
  int j;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  pointer pOVar19;
  vector<Object,_std::allocator<Object>_> *this_00;
  float *mp;
  float *__first;
  long lVar20;
  float fVar21;
  float fVar22;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar26;
  float fVar27;
  undefined1 auVar25 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ulong local_4b8;
  Mat priorbox;
  float local_458;
  float fStack_454;
  float local_448;
  float fStack_444;
  uint local_420;
  uint local_41c;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  class_candidates;
  Mat confidence;
  void *ptr;
  undefined8 uStack_380;
  undefined8 local_378;
  pointer local_370;
  pointer pfStack_368;
  pointer local_360;
  Mat local_358 [96];
  Mat mask;
  Mat maskmaps;
  Mat location;
  undefined4 local_230 [2];
  Mat *local_228;
  undefined8 uStack_220;
  Mat mask2;
  pointer pfStack_210;
  pointer local_208;
  long *local_1d0;
  Extractor ex;
  Mat in;
  undefined8 local_128;
  Mat *pMStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float norm_vals [3];
  float mean_vals [3];
  Net yolact;
  
  ncnn::Net::Net(&yolact);
  yolact.opt.use_vulkan_compute = false;
  ncnn::Net::load_param(&yolact,"yolact.param");
  ncnn::Net::load_model(&yolact,"yolact.bin");
  h = *(uint *)(image + 8);
  w = *(uint *)(image + 0xc);
  ncnn::Mat::from_pixels_resize
            (&in,*(uchar **)(image + 0x10),0x10002,w,h,0x226,0x226,(Allocator *)0x0);
  mean_vals[0] = 123.68;
  mean_vals[1] = 116.78;
  mean_vals[2] = 103.94;
  norm_vals[0] = 0.017123288;
  norm_vals[1] = 0.017507004;
  norm_vals[2] = 0.017427675;
  ncnn::Mat::substract_mean_normalize(&in,mean_vals,norm_vals);
  ncnn::Net::create_extractor(&ex,&yolact);
  ncnn::Extractor::input(&ex,"input.1",&in);
  maskmaps.elemsize._0_4_ = 0;
  maskmaps.elemsize._4_4_ = 0;
  maskmaps.elempack = 0;
  maskmaps.data = (void *)0x0;
  maskmaps.refcount._0_4_ = 0;
  maskmaps.refcount._4_4_ = 0;
  maskmaps.allocator = (Allocator *)0x0;
  maskmaps.dims = 0;
  maskmaps.w = 0;
  maskmaps.h = 0;
  maskmaps.c = 0;
  maskmaps.cstep = 0;
  location.elemsize._0_4_ = 0;
  location.elemsize._4_4_ = 0;
  location.elempack = 0;
  location.data = (void *)0x0;
  location.refcount._0_4_ = 0;
  location.refcount._4_4_ = 0;
  location.allocator = (Allocator *)0x0;
  location.dims = 0;
  location.w = 0;
  location.h = 0;
  location.c = 0;
  location.cstep = 0;
  mask.elemsize._0_4_ = 0;
  mask.elemsize._4_4_ = 0;
  mask.elempack = 0;
  mask.data = (void *)0x0;
  mask.refcount._0_4_ = 0;
  mask.refcount._4_4_ = 0;
  mask.allocator = (Allocator *)0x0;
  mask.dims = 0;
  mask.w = 0;
  mask.h = 0;
  mask.c = 0;
  mask.cstep = 0;
  confidence.elemsize._0_4_ = 0;
  confidence.elemsize._4_4_ = 0;
  confidence.elempack = 0;
  confidence.data = (void *)0x0;
  confidence.refcount._0_4_ = 0;
  confidence.refcount._4_4_ = 0;
  confidence.allocator = (Allocator *)0x0;
  confidence.dims = 0;
  confidence.w = 0;
  confidence.h = 0;
  confidence.c = 0;
  confidence.cstep = 0;
  ncnn::Extractor::extract(&ex,"619",&maskmaps);
  ncnn::Extractor::extract(&ex,"816",&location);
  ncnn::Extractor::extract(&ex,"818",&mask);
  ncnn::Extractor::extract(&ex,"820",&confidence);
  iVar6 = confidence.w;
  __new_size = (size_type)confidence.w;
  iVar7 = confidence.h;
  priorbox.data = (void *)0x0;
  piVar1 = (int *)0x0;
  if (confidence.h != 0) {
    lVar16 = (long)confidence.h * 0x10;
    ptr = (void *)0x0;
    iVar9 = posix_memalign(&ptr,0x10,(long)confidence.h * 0x10 + 4);
    if (iVar9 != 0) {
      ptr = (void *)0x0;
    }
    priorbox.data = ptr;
    piVar1 = (int *)((long)ptr + lVar16);
    *(undefined4 *)((long)ptr + lVar16) = 1;
  }
  lVar16 = 0;
  pvVar11 = priorbox.data;
  do {
    fVar24 = (float)(&DAT_00186ab0)[lVar16];
    iVar9 = (&DAT_00186a90)[lVar16];
    iVar15 = iVar9;
    if (iVar9 < 2) {
      iVar15 = 1;
    }
    iVar12 = 0;
    do {
      iVar14 = 0;
      do {
        pvVar10 = pvVar11;
        lVar20 = 0;
        lVar18 = 0;
        do {
          fVar21 = *(float *)((long)&DAT_00186aa4 + lVar18);
          if (fVar21 < 0.0) {
            fVar21 = sqrtf(fVar21);
          }
          else {
            fVar21 = SQRT(fVar21);
          }
          fVar21 = (fVar21 * fVar24) / 550.0;
          *(float *)((long)pvVar10 + lVar18 * 4) = ((float)iVar14 + 0.5) / (float)iVar9;
          *(float *)((long)pvVar10 + lVar18 * 4 + 4) = ((float)iVar12 + 0.5) / (float)iVar9;
          *(float *)((long)pvVar10 + lVar18 * 4 + 8) = fVar21;
          *(float *)((long)pvVar10 + lVar18 * 4 + 0xc) = fVar21;
          lVar18 = lVar18 + 4;
          lVar20 = lVar20 + -0x10;
        } while (lVar18 != 0xc);
        iVar14 = iVar14 + 1;
        pvVar11 = (void *)((long)pvVar10 - lVar20);
      } while (iVar14 != iVar15);
      iVar12 = iVar12 + 1;
      pvVar11 = (void *)((long)pvVar10 - lVar20);
    } while (iVar12 != iVar15);
    lVar16 = lVar16 + 1;
    pvVar11 = (void *)((long)pvVar10 - lVar20);
  } while (lVar16 != 5);
  class_candidates.
  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(0);
  class_candidates.
  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  class_candidates.
  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::resize(&class_candidates,__new_size);
  if (0 < iVar7) {
    iVar9 = 0;
    do {
      pvVar11 = location.data;
      fVar24 = 0.0;
      iVar15 = 0;
      if (1 < iVar6) {
        uVar17 = 0;
        uVar13 = 1;
        fVar21 = 0.0;
        do {
          fVar24 = *(float *)((long)confidence.data +
                             uVar13 * 4 +
                             (long)(confidence.w * iVar9) *
                             CONCAT44(confidence.elemsize._4_4_,(undefined4)confidence.elemsize));
          if (fVar21 < fVar24) {
            uVar17 = uVar13 & 0xffffffff;
          }
          iVar15 = (int)uVar17;
          if (fVar24 <= fVar21) {
            fVar24 = fVar21;
          }
          uVar13 = uVar13 + 1;
          fVar21 = fVar24;
        } while ((uint)iVar6 != uVar13);
      }
      if ((iVar15 != 0) && (0.2 < fVar24)) {
        lVar16 = (long)iVar9;
        lVar18 = location.w * lVar16 *
                 CONCAT44(location.elemsize._4_4_,(undefined4)location.elemsize);
        __first = (float *)(mask.w * lVar16 *
                            CONCAT44(mask.elemsize._4_4_,(undefined4)mask.elemsize) +
                           (long)mask.data);
        iVar12 = std::__cxx11::string::compare((char *)targetName);
        if (iVar12 == 0) {
          fVar21 = expf(*(float *)((long)pvVar11 + lVar18 + 8) * 0.2);
          fVar22 = expf(*(float *)((long)pvVar11 + lVar18 + 0xc) * 0.2);
          uVar2 = *(undefined8 *)((long)priorbox.data + lVar16 * 0x10);
          uVar3 = *(undefined8 *)((long)priorbox.data + lVar16 * 0x10 + 8);
          fVar26 = (float)uVar3;
          fVar27 = (float)((ulong)uVar3 >> 0x20);
          fVar30 = (float)*(undefined8 *)((long)pvVar11 + lVar18) * 0.1 * fVar26 + (float)uVar2;
          fVar33 = (float)((ulong)*(undefined8 *)((long)pvVar11 + lVar18) >> 0x20) * 0.1 * fVar27 +
                   (float)((ulong)uVar2 >> 0x20);
          fVar21 = fVar21 * fVar26 * 0.5;
          fVar22 = fVar22 * fVar27 * 0.5;
          fVar26 = extraout_XMM0_Db * 0.0 * 0.0;
          fVar27 = extraout_XMM0_Db_00 * 0.0 * 0.0;
          iVar12 = (int)*(undefined8 *)(image + 8);
          iVar14 = (int)((ulong)*(undefined8 *)(image + 8) >> 0x20);
          fVar28 = (float)iVar14;
          fVar29 = (float)iVar12;
          auVar23._0_4_ = (fVar30 - fVar21) * fVar28;
          auVar23._4_4_ = (fVar33 - fVar22) * fVar29;
          auVar23._8_4_ = (0.0 - fVar26) * 0.0;
          auVar23._12_4_ = (0.0 - fVar27) * 0.0;
          auVar25._0_8_ = CONCAT44((float)(iVar12 + -1),(float)(iVar14 + -1));
          auVar25._8_4_ = 0xbf800000;
          auVar25._12_4_ = 0xbf800000;
          auVar31._8_4_ = 0xbf800000;
          auVar31._0_8_ = auVar25._0_8_;
          auVar31._12_4_ = 0xbf800000;
          auVar32 = minps(auVar31,auVar23);
          auVar23 = maxps(ZEXT816(0),auVar32);
          auVar32._4_4_ = (fVar22 + fVar33) * fVar29;
          auVar32._0_4_ = (fVar21 + fVar30) * fVar28;
          auVar32._8_4_ = (fVar26 + 0.0) * 0.0;
          auVar32._12_4_ = (fVar27 + 0.0) * 0.0;
          auVar32 = minps(auVar25,auVar32);
          auVar32 = maxps(ZEXT816(0),auVar32);
          ptr = (void *)0x0;
          uStack_380 = (pointer)0x0;
          local_370 = (pointer)0x0;
          pfStack_368 = (pointer)0x0;
          local_360 = (pointer)0x0;
          cv::Mat::Mat(local_358);
          local_448 = auVar23._0_4_;
          fStack_444 = auVar23._4_4_;
          local_458 = auVar32._0_4_;
          fStack_454 = auVar32._4_4_;
          ptr = auVar23._0_8_;
          uStack_380 = (pointer)CONCAT44((fStack_454 - fStack_444) + 1.0,
                                         (local_458 - local_448) + 1.0);
          local_378 = (pointer)CONCAT44(fVar24,iVar15);
          std::vector<float,std::allocator<float>>::vector<float_const*,void>
                    ((vector<float,std::allocator<float>> *)&mask2,__first,__first + mask.w,
                     (allocator_type *)&local_128);
          pfVar8 = local_360;
          pfVar5 = local_370;
          local_370 = _mask2;
          pfStack_368 = pfStack_210;
          local_360 = local_208;
          _mask2 = (pointer)0x0;
          pfStack_210 = (pointer)0x0;
          local_208 = (pointer)0x0;
          if (pfVar5 != (pointer)0x0) {
            operator_delete(pfVar5,(long)pfVar8 - (long)pfVar5);
          }
          if (_mask2 != (pointer)0x0) {
            operator_delete(_mask2,-(long)_mask2);
          }
          std::vector<Object,_std::allocator<Object>_>::push_back
                    (class_candidates.
                     super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar15,(value_type *)&ptr);
          cv::Mat::~Mat(local_358);
          if (local_370 != (pointer)0x0) {
            operator_delete(local_370,(long)local_360 - (long)local_370);
          }
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar7);
  }
  this_00 = objects;
  std::vector<Object,_std::allocator<Object>_>::_M_erase_at_end
            (objects,(objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  if (0 < (int)((ulong)((long)class_candidates.
                              super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)class_candidates.
                             super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar16 = 0;
    do {
      objects_00 = class_candidates.
                   super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar16;
      pOVar19 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pOVar4 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pOVar19 != pOVar4) {
        this_00 = (vector<Object,_std::allocator<Object>_> *)this;
        qsort_descent_inplace
                  (this,objects_00,0,
                   (int)((ulong)((long)pOVar4 - (long)pOVar19) >> 4) * 0x38e38e39 + -1);
      }
      ptr = (void *)0x0;
      uStack_380 = (pointer)0x0;
      local_378 = (pointer)0x0;
      nms_sorted_bboxes((Yolact *)this_00,objects_00,(vector<int,_std::allocator<int>_> *)&ptr,0.5);
      if (0 < (int)((ulong)((long)uStack_380 - (long)ptr) >> 2)) {
        lVar18 = 0;
        do {
          std::vector<Object,_std::allocator<Object>_>::push_back
                    (objects,(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                             _M_impl.super__Vector_impl_data._M_start +
                             *(int *)((long)ptr + lVar18 * 4));
          lVar18 = lVar18 + 1;
        } while (lVar18 < (int)((ulong)((long)uStack_380 - (long)ptr) >> 2));
      }
      this_00 = (vector<Object,_std::allocator<Object>_> *)ptr;
      if (ptr != (void *)0x0) {
        operator_delete(ptr,(long)local_378 - (long)ptr);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)((ulong)((long)class_candidates.
                                          super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)class_candidates.
                                         super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  pOVar19 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pOVar4 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar19 != pOVar4) {
    qsort_descent_inplace
              (this,objects,0,(int)((ulong)((long)pOVar4 - (long)pOVar19) >> 4) * 0x38e38e39 + -1);
  }
  if (200 < (int)((ulong)((long)(objects->super__Vector_base<Object,_std::allocator<Object>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(objects->super__Vector_base<Object,_std::allocator<Object>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 4) * 0x38e38e39) {
    std::vector<Object,_std::allocator<Object>_>::resize(objects,200);
  }
  pOVar19 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.super__Vector_impl_data
      ._M_finish != pOVar19) {
    local_4b8 = 0;
    do {
      cv::Mat::Mat((Mat *)&ptr,maskmaps.h,maskmaps.w,5);
      _mask2 = (pointer)0x0;
      cv::Mat::operator=((Mat *)&ptr,(Scalar_ *)&mask2);
      pOVar19 = pOVar19 + local_4b8;
      if (0 < (long)maskmaps.c) {
        pfVar5 = (pOVar19->maskdata).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar16 = 0;
        pvVar11 = maskmaps.data;
        do {
          if (0 < maskmaps.h * maskmaps.w) {
            fVar24 = pfVar5[lVar16];
            uVar13 = 0;
            do {
              local_378[uVar13] =
                   (int)(*(float *)((long)pvVar11 + uVar13 * 4) * fVar24 + (float)local_378[uVar13])
              ;
              uVar13 = uVar13 + 1;
            } while ((uint)(maskmaps.h * maskmaps.w) != uVar13);
          }
          lVar16 = lVar16 + 1;
          pvVar11 = (void *)((long)pvVar11 +
                            maskmaps.cstep *
                            CONCAT44(maskmaps.elemsize._4_4_,(undefined4)maskmaps.elemsize));
        } while (lVar16 != maskmaps.c);
      }
      cv::Mat::Mat(&mask2);
      local_118 = 0;
      local_128 = CONCAT44(local_128._4_4_,0x1010000);
      uStack_220 = 0;
      local_230[0] = 0x2010000;
      local_420 = w;
      local_41c = h;
      local_228 = &mask2;
      pMStack_120 = (Mat *)&ptr;
      cv::resize((Mat *)&local_128,local_230,&local_420);
      cv::Mat::Mat((Mat *)&local_128,h,w,0);
      cv::Mat::operator=(&pOVar19->mask,(Mat *)&local_128);
      cv::Mat::~Mat((Mat *)&local_128);
      local_118 = 0;
      uStack_110 = 0;
      local_128 = 0;
      pMStack_120 = (Mat *)0x0;
      cv::Mat::operator=(&pOVar19->mask,(Scalar_ *)&local_128);
      if (0 < (int)h) {
        uVar13 = 0;
        do {
          fVar24 = (pOVar19->rect).y;
          if (((fVar24 <= (float)(int)uVar13) &&
              ((float)(int)uVar13 <= fVar24 + (pOVar19->rect).height)) && (0 < (int)w)) {
            lVar16 = **(long **)&pOVar19->field_0x78;
            lVar18 = *(long *)&pOVar19->field_0x40;
            lVar20 = *local_1d0;
            uVar17 = 0;
            do {
              fVar24 = (pOVar19->rect).x;
              if ((fVar24 <= (float)(int)uVar17) &&
                 ((float)(int)uVar17 <= fVar24 + (pOVar19->rect).width)) {
                *(char *)(lVar16 * uVar13 + lVar18 + uVar17) =
                     -(0.5 < *(float *)(lVar20 * uVar13 + uVar17 * 4));
              }
              uVar17 = uVar17 + 1;
            } while (w != uVar17);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != h);
      }
      cv::Mat::~Mat(&mask2);
      cv::Mat::~Mat((Mat *)&ptr);
      local_4b8 = local_4b8 + 1;
      pOVar19 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar13 = ((long)(objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pOVar19 >> 4) * -0x71c71c71c71c71c7;
    } while (local_4b8 <= uVar13 && uVar13 - local_4b8 != 0);
  }
  std::
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  ::~vector(&class_candidates);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (priorbox.data != (void *)0x0)) {
      free(priorbox.data);
    }
  }
  piVar1 = (int *)CONCAT44(confidence.refcount._4_4_,confidence.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (confidence.allocator == (Allocator *)0x0) {
        if (confidence.data != (void *)0x0) {
          free(confidence.data);
        }
      }
      else {
        (**(code **)(*(long *)confidence.allocator + 0x18))();
      }
    }
  }
  piVar1 = (int *)CONCAT44(mask.refcount._4_4_,mask.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (mask.allocator == (Allocator *)0x0) {
        if (mask.data != (void *)0x0) {
          free(mask.data);
        }
      }
      else {
        (**(code **)(*(long *)mask.allocator + 0x18))();
      }
    }
  }
  piVar1 = (int *)CONCAT44(location.refcount._4_4_,location.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (location.allocator == (Allocator *)0x0) {
        if (location.data != (void *)0x0) {
          free(location.data);
        }
      }
      else {
        (**(code **)(*(long *)location.allocator + 0x18))();
      }
    }
  }
  piVar1 = (int *)CONCAT44(maskmaps.refcount._4_4_,maskmaps.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (maskmaps.allocator == (Allocator *)0x0) {
        if (maskmaps.data != (void *)0x0) {
          free(maskmaps.data);
        }
      }
      else {
        (**(code **)(*(long *)maskmaps.allocator + 0x18))();
      }
    }
  }
  ncnn::Extractor::~Extractor(&ex);
  if (in.refcount != (int *)0x0) {
    LOCK();
    *in.refcount = *in.refcount + -1;
    UNLOCK();
    if (*in.refcount == 0) {
      if (in.allocator == (Allocator *)0x0) {
        if (in.data != (void *)0x0) {
          free(in.data);
        }
      }
      else {
        (**(code **)(*(long *)in.allocator + 0x18))();
      }
    }
  }
  ncnn::Net::~Net(&yolact);
  return 0;
}

Assistant:

int Yolact::detect(cv::Mat& image, std::vector<Object>& objects, const std::string &targetName) 
{
    ncnn::Net yolact;

    yolact.opt.use_vulkan_compute = false;

    // original model converted from https://github.com/dbolya/yolact
    // yolact_resnet50_54_800000.pth
    // the ncnn model https://github.com/nihui/ncnn-assets/tree/master/models
    yolact.load_param("yolact.param");
    yolact.load_model("yolact.bin");

    const int target_size = 550;

    int img_w = image.cols;
    int img_h = image.rows;

    ncnn::Mat in = ncnn::Mat::from_pixels_resize(image.data, ncnn::Mat::PIXEL_BGR2RGB, img_w, img_h, target_size, target_size);

    const float mean_vals[3] = {123.68f, 116.78f, 103.94f};
    const float norm_vals[3] = {1.0 / 58.40f, 1.0 / 57.12f, 1.0 / 57.38f};
    in.substract_mean_normalize(mean_vals, norm_vals);

    ncnn::Extractor ex = yolact.create_extractor();
    //     ex.set_num_threads(4);

    ex.input("input.1", in);

    ncnn::Mat maskmaps;
    ncnn::Mat location;
    ncnn::Mat mask;
    ncnn::Mat confidence;

    ex.extract("619", maskmaps); // 138x138 x 32

    ex.extract("816", location);   // 4 x 19248
    ex.extract("818", mask);       // maskdim 32 x 19248
    ex.extract("820", confidence); // 81 x 19248

    int num_class = confidence.w;
    int num_priors = confidence.h;

    // make priorbox
    ncnn::Mat priorbox(4, num_priors);
    {
        const int conv_ws[5] = {69, 35, 18, 9, 5};
        const int conv_hs[5] = {69, 35, 18, 9, 5};

        const float aspect_ratios[3] = {1.f, 0.5f, 2.f};
        const float scales[5] = {24.f, 48.f, 96.f, 192.f, 384.f};

        float* pb = priorbox;

        for (int p = 0; p < 5; p++)
        {
            int conv_w = conv_ws[p];
            int conv_h = conv_hs[p];

            float scale = scales[p];

            for (int i = 0; i < conv_h; i++)
            {
                for (int j = 0; j < conv_w; j++)
                {
                    // +0.5 because priors are in center-size notation
                    float cx = (j + 0.5f) / conv_w;
                    float cy = (i + 0.5f) / conv_h;

                    for (int k = 0; k < 3; k++)
                    {
                        float ar = aspect_ratios[k];

                        ar = sqrt(ar);

                        float w = scale * ar / 550;
                        float h = scale / ar / 550;

                        // This is for backward compatability with a bug where I made everything square by accident
                        // cfg.backbone.use_square_anchors:
                        h = w;

                        pb[0] = cx;
                        pb[1] = cy;
                        pb[2] = w;
                        pb[3] = h;

                        pb += 4;
                    }
                }
            }
        }
    }

    const float confidence_thresh = 0.2f;
    const float nms_threshold = 0.5f;
    const int keep_top_k = 200;

    std::vector<std::vector<Object> > class_candidates;
    class_candidates.resize(num_class);

    for (int i = 0; i < num_priors; i++)
    {
        const float* conf = confidence.row(i);
        const float* loc = location.row(i);
        const float* pb = priorbox.row(i);
        const float* maskdata = mask.row(i);

        // find class id with highest score
        // start from 1 to skip background
        int label = 0;
        float score = 0.f;
        for (int j = 1; j < num_class; j++)
        {
            float class_score = conf[j];
            if (class_score > score)
            {
                label = j;
                score = class_score;
            }
        }

        // ignore background or low score
        if (label == 0 || score <= confidence_thresh || !isTargetObj(label, targetName))
            continue;

        // CENTER_SIZE
        float var[4] = {0.1f, 0.1f, 0.2f, 0.2f};

        float pb_cx = pb[0];
        float pb_cy = pb[1];
        float pb_w = pb[2];
        float pb_h = pb[3];

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = (float)(exp(var[2] * loc[2]) * pb_w);
        float bbox_h = (float)(exp(var[3] * loc[3]) * pb_h);

        float obj_x1 = bbox_cx - bbox_w * 0.5f;
        float obj_y1 = bbox_cy - bbox_h * 0.5f;
        float obj_x2 = bbox_cx + bbox_w * 0.5f;
        float obj_y2 = bbox_cy + bbox_h * 0.5f;

        // clip
        obj_x1 = std::max(std::min(obj_x1 * image.cols, (float)(image.cols - 1)), 0.f);
        obj_y1 = std::max(std::min(obj_y1 * image.rows, (float)(image.rows - 1)), 0.f);
        obj_x2 = std::max(std::min(obj_x2 * image.cols, (float)(image.cols - 1)), 0.f);
        obj_y2 = std::max(std::min(obj_y2 * image.rows, (float)(image.rows - 1)), 0.f);

        // append object
        Object obj;
        obj.rect = cv::Rect_<float>(obj_x1, obj_y1, obj_x2 - obj_x1 + 1, obj_y2 - obj_y1 + 1);
        obj.label = label;
        obj.prob = score;
        obj.maskdata = std::vector<float>(maskdata, maskdata + mask.w);

        class_candidates[label].push_back(obj);
    }

    objects.clear();
    for (int i = 0; i < (int)class_candidates.size(); i++)
    {
        std::vector<Object>& candidates = class_candidates[i];

        qsort_descent_inplace(candidates);

        std::vector<int> picked;
        nms_sorted_bboxes(candidates, picked, nms_threshold);

        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            objects.push_back(candidates[z]);
        }
    }

    qsort_descent_inplace(objects);

    // keep_top_k
    if (keep_top_k < (int)objects.size())
    {
        objects.resize(keep_top_k);
    }

    // generate mask
    for (int i = 0; i < objects.size(); i++)
    {
        Object& obj = objects[i];

        cv::Mat mask(maskmaps.h, maskmaps.w, CV_32FC1);
        {
            mask = cv::Scalar(0.f);

            for (int p = 0; p < maskmaps.c; p++)
            {
                const float* maskmap = maskmaps.channel(p);
                float coeff = obj.maskdata[p];
                float* mp = (float*)mask.data;

                // mask += m * coeff
                for (int j = 0; j < maskmaps.w * maskmaps.h; j++)
                {
                    mp[j] += maskmap[j] * coeff;
                }
            }
        }

        cv::Mat mask2;
        cv::resize(mask, mask2, cv::Size(img_w, img_h));

        // crop obj box and binarize
        obj.mask = cv::Mat(img_h, img_w, CV_8UC1);
        {
            obj.mask = cv::Scalar(0);

            for (int y = 0; y < img_h; y++)
            {
                if (y < obj.rect.y || y > obj.rect.y + obj.rect.height)
                    continue;

                const float* mp2 = mask2.ptr<const float>(y);
                uchar* bmp = obj.mask.ptr<uchar>(y);

                for (int x = 0; x < img_w; x++)
                {
                    if (x < obj.rect.x || x > obj.rect.x + obj.rect.width)
                        continue;

                    bmp[x] = mp2[x] > 0.5f ? 255 : 0;
                }
            }
        }
    }

    return 0;    
}